

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# PoolList.hpp
# Opt level: O2

EstablisherImpl * __thiscall
PoolList<Server::Private::EstablisherImpl>::allocateFreeItem
          (PoolList<Server::Private::EstablisherImpl> *this)

{
  ItemBlock *pIVar1;
  Item *pIVar2;
  ulong uVar3;
  
  pIVar2 = this->freeItem;
  if (pIVar2 == (Item *)0x0) {
    pIVar1 = (ItemBlock *)operator_new__(0xa8);
    pIVar1->next = this->blocks;
    this->blocks = pIVar1;
    pIVar2 = (Item *)0x0;
    for (uVar3 = 8; uVar3 < 0xa8; uVar3 = uVar3 + 0x28) {
      *(Item **)((long)&pIVar1->next + uVar3) = pIVar2;
      pIVar2 = (Item *)((long)&pIVar1->next + uVar3);
    }
    this->freeItem = pIVar2;
  }
  return (EstablisherImpl *)(pIVar2 + 1);
}

Assistant:

T* allocateFreeItem()
  {
    Item* item = freeItem;
    if(!item)
    {
      ItemBlock* itemBlock = (ItemBlock*)new char[sizeof(ItemBlock) + (sizeof(Item) + sizeof(T)) * 4];
      itemBlock->next = blocks;
      blocks = itemBlock;
      for(Item* i = (Item*)(itemBlock + 1), * end = (Item*)((char*)i + 4 * (sizeof(Item) + sizeof(T)));
        i < end; 
        i = (Item*)((char*)i + (sizeof(Item) + sizeof(T))))
      {
        i->prev = item;
        item = i;
      }
      freeItem = item;
    }
    return (T*)(item + 1);
  }